

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_err_t * mpca_lang_st(mpc_input_t *i,mpca_grammar_st_t *st)

{
  int iVar1;
  mpc_parser_t *p;
  mpc_parser_t *a;
  mpc_parser_t *p_00;
  mpc_parser_t *p_01;
  mpc_parser_t *a_00;
  mpc_parser_t *p_02;
  mpc_parser_t *pmVar2;
  mpc_parser_t *pmVar3;
  mpc_parser_t *pmVar4;
  mpc_parser_t *pmVar5;
  mpc_parser_t *pmVar6;
  mpc_parser_t *pmVar7;
  mpc_parser_t *Base;
  mpc_parser_t *Factor;
  mpc_parser_t *Term;
  mpc_parser_t *Grammar;
  mpc_parser_t *Stmt;
  mpc_parser_t *Lang;
  mpc_err_t *e;
  mpc_result_t r;
  mpca_grammar_st_t *st_local;
  mpc_input_t *i_local;
  
  r = (mpc_result_t)st;
  st_local = (mpca_grammar_st_t *)i;
  p = mpc_new("lang");
  a = mpc_new("stmt");
  p_00 = mpc_new("grammar");
  p_01 = mpc_new("term");
  a_00 = mpc_new("factor");
  p_02 = mpc_new("base");
  pmVar2 = mpc_many(mpca_stmt_fold,a);
  pmVar2 = mpc_predictive(pmVar2);
  pmVar2 = mpc_total(pmVar2,mpca_stmt_list_delete);
  pmVar2 = mpc_apply_to(pmVar2,mpca_stmt_list_apply_to,r.output);
  mpc_define(p,pmVar2);
  pmVar2 = mpc_ident();
  pmVar2 = mpc_tok(pmVar2);
  pmVar3 = mpc_string_lit();
  pmVar3 = mpc_tok(pmVar3);
  pmVar3 = mpc_maybe(pmVar3);
  pmVar4 = mpc_sym(":");
  pmVar5 = mpc_sym(";");
  pmVar2 = mpc_and(5,mpca_stmt_afold,pmVar2,pmVar3,pmVar4,p_00,pmVar5,free,free,free,mpc_soft_delete
                  );
  mpc_define(a,pmVar2);
  pmVar2 = mpc_sym("|");
  pmVar2 = mpc_and(2,mpcf_snd_free,pmVar2,p_00,free);
  pmVar2 = mpc_maybe(pmVar2);
  pmVar2 = mpc_and(2,mpcaf_grammar_or,p_01,pmVar2,mpc_soft_delete);
  mpc_define(p_00,pmVar2);
  pmVar2 = mpc_many1(mpcaf_grammar_and,a_00);
  mpc_define(p_01,pmVar2);
  pmVar2 = mpc_sym("*");
  pmVar3 = mpc_sym("+");
  pmVar4 = mpc_sym("?");
  pmVar5 = mpc_sym("!");
  pmVar6 = mpc_int();
  pmVar6 = mpc_tok_brackets(pmVar6,free);
  pmVar7 = mpc_pass();
  pmVar2 = mpc_or(6,pmVar2,pmVar3,pmVar4,pmVar5,pmVar6,pmVar7);
  pmVar2 = mpc_and(2,mpcaf_grammar_repeat,p_02,pmVar2,mpc_soft_delete);
  mpc_define(a_00,pmVar2);
  pmVar2 = mpc_string_lit();
  pmVar2 = mpc_tok(pmVar2);
  pmVar2 = mpc_apply_to(pmVar2,mpcaf_grammar_string,r.output);
  pmVar3 = mpc_char_lit();
  pmVar3 = mpc_tok(pmVar3);
  pmVar3 = mpc_apply_to(pmVar3,mpcaf_grammar_char,r.output);
  pmVar4 = mpc_regex_lit();
  pmVar5 = mpc_oneof("ms");
  pmVar5 = mpc_many(mpcf_strfold,pmVar5);
  pmVar6 = mpc_lift_val(r.output);
  pmVar4 = mpc_and(3,mpcaf_fold_regex,pmVar4,pmVar5,pmVar6,free,free);
  pmVar4 = mpc_tok(pmVar4);
  pmVar5 = mpc_digits();
  pmVar6 = mpc_ident();
  pmVar5 = mpc_or(2,pmVar5,pmVar6);
  pmVar5 = mpc_tok_braces(pmVar5,free);
  pmVar5 = mpc_apply_to(pmVar5,mpcaf_grammar_id,r.output);
  pmVar6 = mpc_tok_parens(p_00,mpc_soft_delete);
  pmVar2 = mpc_or(5,pmVar2,pmVar3,pmVar4,pmVar5,pmVar6);
  mpc_define(p_02,pmVar2);
  mpc_optimise(p);
  mpc_optimise(a);
  mpc_optimise(p_00);
  mpc_optimise(p_01);
  mpc_optimise(a_00);
  mpc_optimise(p_02);
  iVar1 = mpc_parse_input((mpc_input_t *)st_local,p,(mpc_result_t *)&e);
  if (iVar1 == 0) {
    Lang = (mpc_parser_t *)e;
  }
  else {
    Lang = (mpc_parser_t *)0x0;
  }
  mpc_cleanup(6,p,a,p_00,p_01,a_00,p_02);
  return (mpc_err_t *)Lang;
}

Assistant:

static mpc_err_t *mpca_lang_st(mpc_input_t *i, mpca_grammar_st_t *st) {

  mpc_result_t r;
  mpc_err_t *e;
  mpc_parser_t *Lang, *Stmt, *Grammar, *Term, *Factor, *Base;

  Lang    = mpc_new("lang");
  Stmt    = mpc_new("stmt");
  Grammar = mpc_new("grammar");
  Term    = mpc_new("term");
  Factor  = mpc_new("factor");
  Base    = mpc_new("base");

  mpc_define(Lang, mpc_apply_to(
    mpc_total(mpc_predictive(mpc_many(mpca_stmt_fold, Stmt)), mpca_stmt_list_delete),
    mpca_stmt_list_apply_to, st
  ));

  mpc_define(Stmt, mpc_and(5, mpca_stmt_afold,
    mpc_tok(mpc_ident()), mpc_maybe(mpc_tok(mpc_string_lit())), mpc_sym(":"), Grammar, mpc_sym(";"),
    free, free, free, mpc_soft_delete
  ));

  mpc_define(Grammar, mpc_and(2, mpcaf_grammar_or,
      Term,
      mpc_maybe(mpc_and(2, mpcf_snd_free, mpc_sym("|"), Grammar, free)),
      mpc_soft_delete
  ));

  mpc_define(Term, mpc_many1(mpcaf_grammar_and, Factor));

  mpc_define(Factor, mpc_and(2, mpcaf_grammar_repeat,
    Base,
      mpc_or(6,
        mpc_sym("*"),
        mpc_sym("+"),
        mpc_sym("?"),
        mpc_sym("!"),
        mpc_tok_brackets(mpc_int(), free),
        mpc_pass()),
    mpc_soft_delete
  ));

  mpc_define(Base, mpc_or(5,
    mpc_apply_to(mpc_tok(mpc_string_lit()), mpcaf_grammar_string, st),
    mpc_apply_to(mpc_tok(mpc_char_lit()),   mpcaf_grammar_char, st),
    mpc_tok(mpc_and(3, mpcaf_fold_regex, mpc_regex_lit(), mpc_many(mpcf_strfold, mpc_oneof("ms")), mpc_lift_val(st), free, free)),
    mpc_apply_to(mpc_tok_braces(mpc_or(2, mpc_digits(), mpc_ident()), free), mpcaf_grammar_id, st),
    mpc_tok_parens(Grammar, mpc_soft_delete)
  ));

  mpc_optimise(Lang);
  mpc_optimise(Stmt);
  mpc_optimise(Grammar);
  mpc_optimise(Term);
  mpc_optimise(Factor);
  mpc_optimise(Base);

  if (!mpc_parse_input(i, Lang, &r)) {
    e = r.error;
  } else {
    e = NULL;
  }

  mpc_cleanup(6, Lang, Stmt, Grammar, Term, Factor, Base);

  return e;
}